

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O0

void __thiscall
cfd::core::ElementsConfidentialAddress::CalculateAddress
          (ElementsConfidentialAddress *this,Address *unblinded_address,
          ConfidentialKey *confidential_key)

{
  undefined4 uVar1;
  bool bVar2;
  CfdException *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uchar *puVar7;
  size_type sVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *wally_string;
  allocator local_339;
  string local_338;
  CfdSourceLocation local_318 [4];
  CfdException *except;
  CfdSourceLocation local_298;
  CfdSourceLocation local_280;
  string local_268;
  string local_248;
  reference local_228;
  ElementsBlindAddressFormat *format;
  __normal_iterator<cfd::core::ElementsBlindAddressFormat_*,_std::vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>_>
  local_218;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  *__range2;
  string address;
  AddressFormatData data;
  string hrp;
  uint32_t prefix;
  int ret;
  char *output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey_data;
  string local_128;
  ByteData local_108;
  size_t local_f0;
  string local_e8;
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8;
  ByteData local_78;
  size_t local_60;
  string local_58;
  CfdSourceLocation local_38;
  Pubkey *local_20;
  ConfidentialKey *confidential_key_local;
  Address *unblinded_address_local;
  ElementsConfidentialAddress *this_local;
  
  local_20 = confidential_key;
  confidential_key_local = (ConfidentialKey *)unblinded_address;
  unblinded_address_local = &this->unblinded_address_;
  bVar2 = Pubkey::IsValid(confidential_key);
  if (!bVar2) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0xf0;
    local_38.funcname = "CalculateAddress";
    Pubkey::GetHex_abi_cxx11_(&local_58,local_20);
    Pubkey::GetData(&local_78,local_20);
    local_60 = ByteData::GetDataSize(&local_78);
    logger::warn<std::__cxx11::string,unsigned_long>
              (&local_38,
               "CalculateAddress error. Confidential key is invalid. : confidential_key={}, size={}."
               ,&local_58,&local_60);
    ByteData::~ByteData(&local_78);
    ::std::__cxx11::string::~string((string *)&local_58);
    local_aa = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_a8,"CalculateAddress error. Confidential key is invalid.",&local_a9)
    ;
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_a8);
    local_aa = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar2 = Pubkey::IsCompress(local_20);
  if (!bVar2) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0xfb;
    local_c8.funcname = "CalculateAddress";
    Pubkey::GetHex_abi_cxx11_(&local_e8,local_20);
    Pubkey::GetData(&local_108,local_20);
    local_f0 = ByteData::GetDataSize(&local_108);
    logger::warn<std::__cxx11::string,unsigned_long>
              (&local_c8,
               "CalculateAddress error. Confidential key is not compressed. : confidential_key={}, size={}."
               ,&local_e8,&local_f0);
    ByteData::~ByteData(&local_108);
    ::std::__cxx11::string::~string((string *)&local_e8);
    pubkey_data._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_128,"CalculateAddress error. Confidential key is not compressed.",
               (allocator *)((long)&pubkey_data + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_128);
    pubkey_data._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Pubkey::GetData((ByteData *)&output,local_20);
  ByteData::GetBytes(&local_150,(ByteData *)&output);
  ByteData::~ByteData((ByteData *)&output);
  local_138 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150;
  _prefix = (WallyUtil *)0x0;
  hrp.field_2._12_4_ = 0xffffffff;
  ::std::__cxx11::string::string
            ((string *)&data.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  core::Address::GetAddressFormatData
            ((AddressFormatData *)((long)&address.field_2 + 8),(Address *)confidential_key_local);
  core::Address::GetAddress_abi_cxx11_((string *)&__range2,(Address *)confidential_key_local);
  GetBlindKeyPair();
  __end2 = ::std::
           vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
           ::begin((vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                    *)&__begin2);
  local_218._M_current =
       (ElementsBlindAddressFormat *)
       ::std::
       vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
       ::end((vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
              *)&__begin2);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&local_218);
    if (!bVar2) {
      format._4_4_ = 2;
LAB_003105a0:
      ::std::
      vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
      ::~vector((vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                 *)&__begin2);
      if (format._4_4_ == 2) {
        local_318[0].filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                     ,0x2f);
        local_318[0].filename = local_318[0].filename + 1;
        local_318[0].line = 0x133;
        local_318[0].funcname = "CalculateAddress";
        logger::warn<std::__cxx11::string&>
                  (local_318,"CalculateAddress error. Address prefix not found. : address={}.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_338,"CalculateAddress address prefix not found.",&local_339);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_338);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::~string((string *)&__range2);
      AddressFormatData::~AddressFormatData((AddressFormatData *)((long)&address.field_2 + 8));
      ::std::__cxx11::string::~string
                ((string *)&data.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
      return;
    }
    local_228 = __gnu_cxx::
                __normal_iterator<cfd::core::ElementsBlindAddressFormat_*,_std::vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>_>
                ::operator*(&__end2);
    _prefix = (WallyUtil *)0x0;
    if ((local_228->is_segwit & 1U) == 0) {
      hrp.field_2._8_4_ =
           AddressFormatData::GetValue
                     ((AddressFormatData *)((long)&address.field_2 + 8),
                      &local_228->blinded_prefix_key);
      uVar4 = ::std::__cxx11::string::c_str();
      uVar1 = hrp.field_2._8_4_;
      puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_138);
      sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_138);
      hrp.field_2._12_4_ = wally_confidential_addr_from_addr(uVar4,uVar1,puVar7,sVar8,&prefix);
      wally_string = extraout_RDX_01;
      if (hrp.field_2._12_4_ != 0) {
        local_298.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                     ,0x2f);
        local_298.filename = local_298.filename + 1;
        local_298.line = 0x120;
        local_298.funcname = "CalculateAddress";
        logger::trace<int&>(&local_298,"fail libwally. ret={}",
                            (int *)(hrp.field_2._M_local_buf + 0xc));
        wally_string = extraout_RDX_02;
      }
    }
    else {
      AddressFormatData::GetString
                (&local_248,(AddressFormatData *)((long)&address.field_2 + 8),
                 &local_228->blinded_prefix_key);
      ::std::__cxx11::string::operator=
                ((string *)&data.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)&local_248);
      ::std::__cxx11::string::~string((string *)&local_248);
      uVar4 = ::std::__cxx11::string::c_str();
      AddressFormatData::GetString
                (&local_268,(AddressFormatData *)((long)&address.field_2 + 8),&local_228->prefix_key
                );
      uVar5 = ::std::__cxx11::string::c_str();
      uVar6 = ::std::__cxx11::string::c_str();
      puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_138);
      sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_138);
      hrp.field_2._12_4_ =
           wally_confidential_addr_from_addr_segwit(uVar4,uVar5,uVar6,puVar7,sVar8,&prefix);
      ::std::__cxx11::string::~string((string *)&local_268);
      wally_string = extraout_RDX;
      if (hrp.field_2._12_4_ != 0) {
        local_280.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                     ,0x2f);
        local_280.filename = local_280.filename + 1;
        local_280.line = 0x118;
        local_280.funcname = "CalculateAddress";
        logger::trace<int&>(&local_280,"fail libwally. ret={}",
                            (int *)(hrp.field_2._M_local_buf + 0xc));
        wally_string = extraout_RDX_00;
      }
    }
    if (hrp.field_2._12_4_ == 0) {
      WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)&except,_prefix,wally_string);
      ::std::__cxx11::string::operator=((string *)&this->address_,(string *)&except);
      ::std::__cxx11::string::~string((string *)&except);
      Pubkey::operator=(&this->confidential_key_,local_20);
      core::Address::operator=(&this->unblinded_address_,(Address *)confidential_key_local);
      format._4_4_ = 1;
      goto LAB_003105a0;
    }
    __gnu_cxx::
    __normal_iterator<cfd::core::ElementsBlindAddressFormat_*,_std::vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ElementsConfidentialAddress::CalculateAddress(
    const Address& unblinded_address,
    const ConfidentialKey& confidential_key) {
  if (!confidential_key.IsValid()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is invalid."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is invalid.");
  }
  // 33bytes: ConfidentialKey
  if (!confidential_key.IsCompress()) {
    warn(
        CFD_LOG_SOURCE,
        "CalculateAddress error. Confidential key is not compressed."
        " : confidential_key={}, size={}.",
        confidential_key.GetHex(), confidential_key.GetData().GetDataSize());
    throw CfdException(
        kCfdIllegalArgumentError,
        "CalculateAddress error. Confidential key is not compressed.");
  }

  const std::vector<uint8_t>& pubkey_data =
      confidential_key.GetData().GetBytes();
  char* output = nullptr;

  int ret = -1;
  uint32_t prefix;
  std::string hrp;
  AddressFormatData data = unblinded_address.GetAddressFormatData();
  std::string address = unblinded_address.GetAddress();
  for (const auto& format : GetBlindKeyPair()) {
    try {
      output = nullptr;

      // Get confidential_key
      if (format.is_segwit) {
        hrp = data.GetString(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr_segwit(
            address.c_str(), data.GetString(format.prefix_key).c_str(),
            hrp.c_str(), pubkey_data.data(), pubkey_data.size(), &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      } else {
        prefix = data.GetValue(format.blinded_prefix_key);
        ret = wally_confidential_addr_from_addr(
            address.c_str(), prefix, pubkey_data.data(), pubkey_data.size(),
            &output);
        if (ret != WALLY_OK) {
          trace(CFD_LOG_SOURCE, "fail libwally. ret={}", ret);
        }
      }

      if (ret == WALLY_OK) {
        address_ = WallyUtil::ConvertStringAndFree(output);
        confidential_key_ = confidential_key;
        unblinded_address_ = unblinded_address;
        return;
      }
    } catch (const CfdException& except) {
      // Ignore
      trace(
          CFD_LOG_SOURCE, "CalculateAddress exception={}",
          std::string(except.what()));
    }
  }

  warn(
      CFD_LOG_SOURCE,
      "CalculateAddress error. Address prefix not found."
      " : address={}.",
      address);
  throw CfdException(
      kCfdIllegalArgumentError, "CalculateAddress address prefix not found.");
}